

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::~CTcTokenizer(CTcTokenizer *this)

{
  CTcTokFileDesc *pCVar1;
  CTcTokenEle *pCVar2;
  tctok_incfile_t *ptVar3;
  tctok_incpath_t *ptVar4;
  CTcMacroRsc *pCVar5;
  CTcTokSrcBlock *this_00;
  CVmHashTable *pCVar6;
  CTcTokenEle *pCVar7;
  tctok_incfile_t *__ptr;
  tctok_incpath_t *__ptr_00;
  CTcTokFileDesc *this_01;
  CTcMacroRsc *this_02;
  
  delete_source(this);
  if (this->string_fp_ != (CVmDataSource *)0x0) {
    (*this->string_fp_->_vptr_CVmDataSource[1])();
  }
  this_01 = this->desc_head_;
  while (this_01 != (CTcTokFileDesc *)0x0) {
    pCVar1 = this_01->next_;
    CTcTokFileDesc::~CTcTokFileDesc(this_01);
    operator_delete(this_01,0x58);
    this->desc_head_ = pCVar1;
    this_01 = pCVar1;
  }
  this->unget_cur_ = (CTcTokenEle *)0x0;
  pCVar7 = this->unget_head_;
  while (pCVar7 != (CTcTokenEle *)0x0) {
    pCVar2 = pCVar7->nxt_;
    operator_delete(pCVar7,0x38);
    this->unget_head_ = pCVar2;
    pCVar7 = pCVar2;
  }
  free(this->desc_list_);
  lib_free_str(this->default_charset_);
  CCharmap::release_ref(&this->default_mapper_->super_CCharmap);
  __ptr = this->prev_includes_;
  while (__ptr != (tctok_incfile_t *)0x0) {
    ptVar3 = __ptr->nxt;
    free(__ptr);
    this->prev_includes_ = ptVar3;
    __ptr = ptVar3;
  }
  __ptr_00 = this->incpath_head_;
  while (__ptr_00 != (tctok_incpath_t *)0x0) {
    ptVar4 = __ptr_00->nxt;
    free(__ptr_00);
    this->incpath_head_ = ptVar4;
    __ptr_00 = ptVar4;
  }
  this_02 = this->macro_res_head_;
  while (this_02 != (CTcMacroRsc *)0x0) {
    pCVar5 = this_02->next_;
    CTcMacroRsc::~CTcMacroRsc(this_02);
    operator_delete(this_02,0x70);
    this->macro_res_head_ = pCVar5;
    this_02 = pCVar5;
  }
  this_00 = this->src_head_;
  if (this_00 != (CTcTokSrcBlock *)0x0) {
    CTcTokSrcBlock::~CTcTokSrcBlock(this_00);
  }
  operator_delete(this_00,0xc358);
  if (this->defines_ != (CTcMacroTable *)0x0) {
    (*this->defines_->_vptr_CTcMacroTable[1])();
  }
  pCVar6 = this->undefs_;
  if (pCVar6 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar6);
  }
  operator_delete(pCVar6,0x20);
  pCVar6 = this->kw_;
  if (pCVar6 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar6);
  }
  operator_delete(pCVar6,0x20);
  if (this->string_fp_map_ != (CCharmapToLocal *)0x0) {
    CCharmap::release_ref(&this->string_fp_map_->super_CCharmap);
  }
  CTcTokString::~CTcTokString(&this->defbuf_);
  CTcTokString::~CTcTokString(&this->expbuf_);
  CTcTokString::~CTcTokString(&this->unsplicebuf_);
  CTcTokString::~CTcTokString(&this->linebuf_);
  return;
}

Assistant:

CTcTokenizer::~CTcTokenizer()
{
    /* delete all streams */
    delete_source();

    /* delete the string capture file */
    if (string_fp_ != 0)
        delete string_fp_;

    /* delete all file descriptors */
    while (desc_head_ != 0)
    {
        /* remember the next descriptor */
        CTcTokFileDesc *nxt = desc_head_->get_next();

        /* delete this one */
        delete desc_head_;

        /* move on to the next one */
        desc_head_ = nxt;
    }

    /* delete the unget list */
    unget_cur_ = 0;
    while (unget_head_ != 0)
    {
        /* remember the next element */
        CTcTokenEle *nxt = unget_head_->getnxt();

        /* delete this element */
        delete unget_head_;

        /* advance to the next element */
        unget_head_ = nxt;
    }

    /* delete the file descriptor index array */
    if (desc_list_ != 0)
        t3free(desc_list_);

    /* delete our default character set string copy */
    lib_free_str(default_charset_);

    /* release our reference on our default character mapper */
    default_mapper_->release_ref();

    /* forget about all of our previous include files */
    while (prev_includes_ != 0)
    {
        tctok_incfile_t *nxt;

        /* remember the next file */
        nxt = prev_includes_->nxt;

        /* delete this one */
        t3free(prev_includes_);

        /* move on to the next one */
        prev_includes_ = nxt;
    }

    /* delete the include path list */
    while (incpath_head_ != 0)
    {
        tctok_incpath_t *nxt;

        /* remember the next entry in the path */
        nxt = incpath_head_->nxt;

        /* delete this entry */
        t3free(incpath_head_);

        /* move on to the next one */
        incpath_head_ = nxt;
    }

    /* delete the macro resources */
    while (macro_res_head_ != 0)
    {
        CTcMacroRsc *nxt;

        /* remember the next one */
        nxt = macro_res_head_->next_;

        /* delete this one */
        delete macro_res_head_;

        /* move on to the next one */
        macro_res_head_ = nxt;
    }

    /* delete the token list */
    delete src_head_;

    /* delete the #define and #undef symbol tables */
    delete defines_;
    delete undefs_;

    /* delete the keyword hash table */
    delete kw_;

    /* if we created a mapping for the string capture file, release it */
    if (string_fp_map_ != 0)
        string_fp_map_->release_ref();
}